

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall tadsobj_sc_search_ctx::to_next(tadsobj_sc_search_ctx *this)

{
  int iVar1;
  vm_tadsobj_hdr *pvVar2;
  tadsobj_objid_and_ptr *ptVar3;
  int *in_RDI;
  vm_tadsobj_sc *sc;
  vm_tadsobj_hdr *in_stack_00000028;
  uint local_4;
  
  while( true ) {
    if (*(long *)(in_RDI + 2) != 0) {
      iVar1 = **(int **)(in_RDI + 2);
      *in_RDI = iVar1;
      if (iVar1 != 0) {
        pvVar2 = CVmObjTads::get_hdr(*(CVmObjTads **)(*(long *)(in_RDI + 2) + 8));
        *(vm_tadsobj_hdr **)(in_RDI + 4) = pvVar2;
        *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + 0x10;
      }
      local_4 = (uint)(iVar1 != 0);
      return local_4;
    }
    if (*(short *)(*(long *)(in_RDI + 4) + 0x24) == 0) break;
    if (*(short *)(*(long *)(in_RDI + 4) + 0x24) == 1) {
      *in_RDI = *(int *)(*(long *)(in_RDI + 4) + 0x28);
      pvVar2 = CVmObjTads::get_hdr(*(CVmObjTads **)(*(long *)(in_RDI + 4) + 0x30));
      *(vm_tadsobj_hdr **)(in_RDI + 4) = pvVar2;
      return 1;
    }
    ptVar3 = vm_tadsobj_hdr::get_inh_search_path(in_stack_00000028);
    *(tadsobj_objid_and_ptr **)(in_RDI + 2) = ptVar3;
  }
  return 0;
}

Assistant:

int to_next(VMG0_)
    {
        /* check for a path */
    try_again:
        if (path_sc == 0)
        {
            /* 
             *   we're not working on a path at all - this means we're
             *   working directly on a (so far) single-inheritance superclass
             *   chain, so simply follow the chain up to the next superclass 
             */

            /* we have no path, so look at our object's superclasses */
            switch(curhdr->sc_cnt)
            {
            case 1:
                /* we have exactly one superclass, so traverse to it */
                {
                    const vm_tadsobj_sc *sc = curhdr->sc;
                    cur = sc->id;
                    curhdr = sc->objp->get_hdr();
                }
                return TRUE;

            case 0:
                /* we have no superclasses, so there's nowhere to go */
                return FALSE;

            default:
                /* we have multiple superclasses, so set up a search path */
                path_sc = curhdr->get_inh_search_path(vmg0_);

                /* start over with the search path */
                goto try_again;
            }
        }
        else if ((cur = path_sc->id) != VM_INVALID_OBJ)
        {
            /*
             *   we're working on a path, and we have elements remaining -
             *   move on to the next element 
             */
            curhdr = path_sc->objp->get_hdr();
            ++path_sc;

            /* got it */
            return TRUE;
        }
        else
        {
            /* 
             *   we're working on a path, and we're out of elements - we have
             *   nowhere else to go 
             */
            return FALSE;
        }
    }